

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O0

void __thiscall OpenMD::HBondJump::postCorrelate(HBondJump *this)

{
  double dVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  long in_RDI;
  uint i;
  undefined4 local_c;
  
  for (local_c = 0; local_c < *(uint *)(in_RDI + 0x38); local_c = local_c + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x58),(ulong)local_c);
    if (*pvVar3 < 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),(ulong)local_c)
      ;
      *pvVar4 = 0.0;
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x58),(ulong)local_c);
      iVar2 = *pvVar3;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),(ulong)local_c)
      ;
      *pvVar4 = *pvVar4 / (double)iVar2;
    }
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),(ulong)local_c);
    dVar1 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),(ulong)local_c);
    *pvVar4 = 1.0 - dVar1;
  }
  return;
}

Assistant:

void HBondJump::postCorrelate() {
    for (unsigned int i = 0; i < nTimeBins_; ++i) {
      if (count_[i] > 0) {
        histogram_[i] /= count_[i];
      } else {
        histogram_[i] = 0;
      }
      histogram_[i] = 1.0 - histogram_[i];
    }
  }